

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_params.cpp
# Opt level: O0

vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_> *
libtorrent::anon_unknown_78::default_plugins
          (vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           *__return_storage_ptr__,bool empty)

{
  initializer_list<std::shared_ptr<libtorrent::plugin>_> __l;
  shared_ptr<libtorrent::plugin> *local_d8;
  allocator<std::shared_ptr<libtorrent::plugin>_> local_a2;
  undefined1 local_a1;
  shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper> local_a0;
  shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper> local_90 [2];
  shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper> local_70;
  shared_ptr<libtorrent::plugin> *local_60;
  shared_ptr<libtorrent::plugin> local_58;
  shared_ptr<libtorrent::plugin> local_48;
  shared_ptr<libtorrent::plugin> local_38;
  shared_ptr<libtorrent::plugin> local_28;
  undefined1 local_11;
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  *pvStack_10;
  bool empty_local;
  
  local_11 = empty;
  pvStack_10 = __return_storage_ptr__;
  if (empty) {
    memset(__return_storage_ptr__,0,0x18);
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    local_a1 = 1;
    local_60 = &local_58;
    ::std::
    make_shared<libtorrent::aux::session_impl::session_plugin_wrapper,std::shared_ptr<libtorrent::torrent_plugin>(&)(libtorrent::torrent_handle_const&,libtorrent::client_data_t)>
              ((_func_shared_ptr<libtorrent::torrent_plugin>_torrent_handle_ptr_client_data_t *)
               &local_70);
    ::std::shared_ptr<libtorrent::plugin>::
    shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper,void>(&local_58,&local_70);
    local_60 = &local_48;
    ::std::
    make_shared<libtorrent::aux::session_impl::session_plugin_wrapper,std::shared_ptr<libtorrent::torrent_plugin>(&)(libtorrent::torrent_handle_const&,libtorrent::client_data_t)>
              ((_func_shared_ptr<libtorrent::torrent_plugin>_torrent_handle_ptr_client_data_t *)
               local_90);
    ::std::shared_ptr<libtorrent::plugin>::
    shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper,void>(&local_48,local_90);
    local_60 = &local_38;
    ::std::
    make_shared<libtorrent::aux::session_impl::session_plugin_wrapper,std::shared_ptr<libtorrent::torrent_plugin>(&)(libtorrent::torrent_handle_const&,libtorrent::client_data_t)>
              ((_func_shared_ptr<libtorrent::torrent_plugin>_torrent_handle_ptr_client_data_t *)
               &local_a0);
    ::std::shared_ptr<libtorrent::plugin>::
    shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper,void>(&local_38,&local_a0);
    local_a1 = 0;
    local_28.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_58;
    local_28.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
    ::std::allocator<std::shared_ptr<libtorrent::plugin>_>::allocator(&local_a2);
    __l._M_len = (size_type)
                 local_28.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    __l._M_array = (iterator)
                   local_28.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::vector(__return_storage_ptr__,__l,&local_a2);
    ::std::allocator<std::shared_ptr<libtorrent::plugin>_>::~allocator(&local_a2);
    local_d8 = &local_28;
    do {
      local_d8 = local_d8 + -1;
      ::std::shared_ptr<libtorrent::plugin>::~shared_ptr(local_d8);
    } while (local_d8 != &local_58);
    ::std::shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper>::~shared_ptr(&local_a0)
    ;
    ::std::shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper>::~shared_ptr(local_90);
    ::std::shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper>::~shared_ptr(&local_70)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<plugin>> default_plugins(
	bool empty = false)
{
#ifndef TORRENT_DISABLE_EXTENSIONS
	if (empty) return {};
	using wrapper = aux::session_impl::session_plugin_wrapper;
	return {
		std::make_shared<wrapper>(create_ut_pex_plugin),
		std::make_shared<wrapper>(create_ut_metadata_plugin),
		std::make_shared<wrapper>(create_smart_ban_plugin)
	};
#else
	TORRENT_UNUSED(empty);
	return {};
#endif
}